

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O1

CreateMultisigResponseStruct *
cfd::js::api::AddressApiBase::CreateMultisig
          (CreateMultisigResponseStruct *__return_storage_ptr__,CreateMultisigRequestStruct *request
          ,AddressFactory *address_factory)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pbVar4;
  pointer pcVar5;
  AddressType AVar6;
  CreateMultisigResponseStruct *this;
  char cVar7;
  CfdException *this_00;
  pointer pbVar8;
  Script *pSVar9;
  AddressType addr_type;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  Script witness_script;
  Script redeem_script;
  Script multisig_script;
  Script scriptsig;
  Script locking_script;
  Address addr;
  AddressType local_314;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  CreateMultisigResponseStruct *local_2f0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2e8;
  AddressFactory *local_2d0;
  CreateMultisigRequestStruct *local_2c8;
  Script local_2c0;
  Script local_288;
  Script local_250;
  Script local_218;
  Script local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char local_188 [16];
  void *local_178;
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (__return_storage_ptr__->address)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->address).field_2;
  (__return_storage_ptr__->address)._M_string_length = 0;
  (__return_storage_ptr__->address).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->redeem_script)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->redeem_script).field_2;
  (__return_storage_ptr__->redeem_script)._M_string_length = 0;
  (__return_storage_ptr__->redeem_script).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->witness_script)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_script).field_2;
  (__return_storage_ptr__->witness_script)._M_string_length = 0;
  (__return_storage_ptr__->witness_script).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0 = __return_storage_ptr__;
  local_314 = ConvertAddressType(&request->hash_type);
  local_2d0 = address_factory;
  if (local_314 != kP2shP2wshAddress && (local_314 & kP2shP2wshAddress) != kP2shAddress) {
    local_1a8._0_8_ = "cfdjs_address_base.cpp";
    local_1a8._8_4_ = 0x79;
    local_198._M_allocated_capacity = 0x8e6062;
    core::logger::log<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,
               "Failed to CreateMultisig. Invalid address_type passed:  addressType={}",&local_314);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",""
              );
    core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_2e8.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar8 = (request->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (request->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8 = request;
  if (pbVar8 != pbVar4) {
    do {
      pcVar5 = (pbVar8->_M_dataplus)._M_p;
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar5,pcVar5 + pbVar8->_M_string_length);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_2c0,(string *)local_1a8);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
      emplace_back<cfd::core::Pubkey>(&local_2e8,(Pubkey *)&local_2c0);
      if (local_2c0._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_2c0._vptr_Script);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar4);
  }
  bVar3 = local_2c8->nrequired;
  cfd::core::Script::Script(&local_2c0);
  cfd::core::Script::Script(&local_288);
  AVar6 = local_314;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&local_250,(vector *)(ulong)bVar3,SUB81(&local_2e8,0));
  cfd::core::Script::Script(&local_1e0);
  cfd::core::Script::Script(&local_218);
  pSVar9 = &local_250;
  cfd::AddressFactory::CreateAddress
            ((AddressType)local_1a8,(Pubkey *)local_2d0,(Script *)(ulong)local_314,(Script *)0x0,
             pSVar9);
  this = local_2f0;
  if (AVar6 != kP2shAddress) {
    cfd::core::Script::operator=(&local_2c0,&local_250);
    pSVar9 = &local_218;
    cVar7 = cfd::core::Script::IsEmpty();
    if (cVar7 != '\0') goto LAB_00720499;
  }
  cfd::core::Script::operator=(&local_288,pSVar9);
LAB_00720499:
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,(string *)&local_310);
  paVar2 = &local_310.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  cVar7 = cfd::core::Script::IsEmpty();
  if (cVar7 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&this->redeem_script);
  }
  else {
    local_310._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"redeemScript","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ignore_items,&local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  cVar7 = cfd::core::Script::IsEmpty();
  if (cVar7 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&this->witness_script);
  }
  else {
    local_310._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"witnessScript","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ignore_items,&local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  core::Script::~Script(&local_a0);
  local_130[0] = cfd::core::Privkey::Privkey;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  core::TapBranch::~TapBranch((TapBranch *)local_130);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
  }
  if ((char *)local_198._M_allocated_capacity != local_188) {
    operator_delete((void *)local_198._M_allocated_capacity);
  }
  core::Script::~Script(&local_218);
  core::Script::~Script(&local_1e0);
  core::Script::~Script(&local_250);
  core::Script::~Script(&local_288);
  core::Script::~Script(&local_2c0);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_2e8);
  return this;
}

Assistant:

CreateMultisigResponseStruct AddressApiBase::CreateMultisig(
    const CreateMultisigRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateMultisigResponseStruct response;
  AddressType addr_type = ConvertAddressType(request.hash_type);
  if ((addr_type != AddressType::kP2shAddress) &&
      (addr_type != AddressType::kP2wshAddress) &&
      (addr_type != AddressType::kP2shP2wshAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        addr_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  std::vector<Pubkey> pubkeys;
  for (std::string key : request.keys) {
    pubkeys.push_back(Pubkey(key));
  }

  uint32_t req_sig_num = static_cast<uint32_t>(request.nrequired);
  Script witness_script;
  Script redeem_script;

  bool is_witness = (addr_type != AddressType::kP2shAddress);
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys, is_witness);
  Script locking_script;
  Script scriptsig;
  Address addr = address_factory->CreateAddress(
      addr_type, nullptr, &multisig_script, &locking_script, &scriptsig);
  if (is_witness) {
    witness_script = multisig_script;
    if (!scriptsig.IsEmpty()) {
      redeem_script = scriptsig;
    }
  } else {
    redeem_script = multisig_script;
  }

  response.address = addr.GetAddress();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  if (witness_script.IsEmpty()) {
    response.ignore_items.insert("witnessScript");
  } else {
    response.witness_script = witness_script.GetHex();
  }
  return response;
}